

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_coalesce.cpp
# Opt level: O2

unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true> __thiscall
duckdb::Transformer::TransformCoalesce(Transformer *this,PGAExpr *root)

{
  PGList *pPVar1;
  pointer pOVar2;
  long in_RDX;
  optional_ptr<duckdb_libpgquery::PGList,_true> coalesce_args;
  undefined1 local_40 [8];
  _Head_base<0UL,_duckdb::OperatorExpression_*,_false> local_38;
  optional_ptr<duckdb_libpgquery::PGList,_true> local_30;
  
  local_30.ptr = *(PGList **)(in_RDX + 0x10);
  local_40[0] = OPERATOR_COALESCE;
  make_uniq<duckdb::OperatorExpression,duckdb::ExpressionType>((duckdb *)&local_38,local_40);
  pPVar1 = optional_ptr<duckdb_libpgquery::PGList,_true>::operator->(&local_30);
  while (pPVar1 = (PGList *)pPVar1->head, pPVar1 != (PGList *)0x0) {
    TransformExpression((Transformer *)local_40,(optional_ptr<duckdb_libpgquery::PGNode,_true>)root)
    ;
    pOVar2 = unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
             ::operator->((unique_ptr<duckdb::OperatorExpression,_std::default_delete<duckdb::OperatorExpression>,_true>
                           *)&local_38);
    ::std::
    vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
              ((vector<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>,std::allocator<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>>
                *)&pOVar2->children,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_40);
    if ((long *)CONCAT71(local_40._1_7_,local_40[0]) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_40._1_7_,local_40[0]) + 8))();
    }
  }
  (this->parent).ptr = (Transformer *)local_38._M_head_impl;
  return (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)
         (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>)this;
}

Assistant:

unique_ptr<ParsedExpression> Transformer::TransformCoalesce(duckdb_libpgquery::PGAExpr &root) {
	auto coalesce_args = PGPointerCast<duckdb_libpgquery::PGList>(root.lexpr);
	D_ASSERT(coalesce_args->length > 0); // parser ensures this already

	auto coalesce_op = make_uniq<OperatorExpression>(ExpressionType::OPERATOR_COALESCE);
	for (auto cell = coalesce_args->head; cell; cell = cell->next) {
		// get the value of the COALESCE
		auto value_expr = TransformExpression(PGPointerCast<duckdb_libpgquery::PGNode>(cell->data.ptr_value));
		coalesce_op->children.push_back(std::move(value_expr));
	}
	return std::move(coalesce_op);
}